

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

ClosureContext __thiscall
runtime::VirtualMachine::loadClosure(VirtualMachine *this,ClosureContext *closure)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined4 uVar3;
  ClosureContext CVar4;
  bool bVar5;
  element_type *peVar6;
  size_type sVar7;
  element_type *peVar8;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  shared_ptr<runtime::StackFrame> outer;
  size_t i;
  shared_ptr<runtime::StackFrame> scope;
  ClosureContext *closure_local;
  VirtualMachine *this_local;
  ClosureContext cc;
  
  scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)closure;
  std::shared_ptr<runtime::StackFrame>::shared_ptr
            ((shared_ptr<runtime::StackFrame> *)&i,&this->stackFrame);
  outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  while( true ) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        (scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_vptr__Sp_counted_base <=
        outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    {
      uVar2._0_4_ = (scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count;
      uVar2._4_4_ = (scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_weak_count;
      peVar6 = std::
               __shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&i);
      sVar7 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::size
                        (&peVar6->locals);
      if (sVar7 <= uVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,
                   "closure.localIndex out of bounds for scope when trying to find closure value",
                   &local_a9);
        panic(this,&local_a8);
      }
      peVar8 = std::__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2> *)&i);
      uVar1 = (scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi)->_M_use_count;
      uVar3 = (scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi)->_M_weak_count;
      CVar4.scopeIndex._4_4_ = uVar3;
      CVar4.scopeIndex._0_4_ = uVar1;
      std::shared_ptr<runtime::StackFrame>::~shared_ptr((shared_ptr<runtime::StackFrame> *)&i);
      CVar4.stackFrame = peVar8;
      return CVar4;
    }
    peVar6 = std::__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&i);
    std::shared_ptr<runtime::StackFrame>::shared_ptr
              ((shared_ptr<runtime::StackFrame> *)local_50,&peVar6->function->scopeOuter);
    bVar5 = std::operator==((shared_ptr<runtime::StackFrame> *)local_50,(nullptr_t)0x0);
    if (bVar5) break;
    std::shared_ptr<runtime::StackFrame>::operator=
              ((shared_ptr<runtime::StackFrame> *)&i,(shared_ptr<runtime::StackFrame> *)local_50);
    std::shared_ptr<runtime::StackFrame>::~shared_ptr((shared_ptr<runtime::StackFrame> *)local_50);
    outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"No outer scope found for closure",&local_71);
  panic(this,&local_70);
}

Assistant:

runtime::ClosureContext runtime::VirtualMachine::loadClosure(const bytecode::ClosureContext& closure) {
  // we start at offset of 1 because those offsets are determined from within the function scope
  // are we are not technically within the function scope also offset of zero means local
  auto scope = this->stackFrame;
  for (std::size_t i = 1; i < closure.scopeOffsets; i++) {
    auto outer = scope->function->scopeOuter;
    if (outer == nullptr) {
      this->panic("No outer scope found for closure");
    }
    scope = outer;
  }

  if (closure.localIndex >= scope->locals.size()) {
    this->panic("closure.localIndex out of bounds for scope when trying to find closure value");
  }

  runtime::ClosureContext cc;
  cc.stackFrame = scope.get();
  cc.scopeIndex = closure.localIndex;
  return cc;
}